

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

string * __thiscall
deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_(string *__return_storage_ptr__,Spec *this)

{
  ArraySpec *pAVar1;
  ArraySpec *pAVar2;
  size_type sVar3;
  ostream *poVar4;
  Storage extraout_EDX;
  Storage extraout_EDX_00;
  Storage storage;
  InputType type;
  OutputType type_00;
  Usage usage;
  char *pcVar5;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  const_reference local_1b0;
  ArraySpec *array;
  size_t ndx;
  stringstream name;
  ostream local_190 [376];
  Spec *local_18;
  Spec *this_local;
  
  local_18 = this;
  this_local = (Spec *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&ndx);
  for (array = (ArraySpec *)0x0; pAVar1 = array,
      pAVar2 = (ArraySpec *)
               std::
               vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
               ::size(&this->arrays), pAVar1 < pAVar2;
      array = (ArraySpec *)((long)&array->inputType + 1)) {
    local_1b0 = std::
                vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                ::operator[](&this->arrays,(size_type)array);
    sVar3 = std::
            vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ::size(&this->arrays);
    storage = extraout_EDX;
    if (1 < sVar3) {
      poVar4 = std::operator<<(local_190,"array");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ulong)array);
      std::operator<<(poVar4,"_");
      storage = extraout_EDX_00;
    }
    gls::Array::storageToString_abi_cxx11_(&local_1e0,(Array *)(ulong)local_1b0->storage,storage);
    poVar4 = std::operator<<(local_190,(string *)&local_1e0);
    poVar4 = std::operator<<(poVar4,"_");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1b0->offset);
    poVar4 = std::operator<<(poVar4,"_");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1b0->stride);
    poVar4 = std::operator<<(poVar4,"_");
    gls::Array::inputTypeToString_abi_cxx11_(&local_200,(Array *)(ulong)local_1b0->inputType,type);
    std::operator<<(poVar4,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_1e0);
    if ((local_1b0->inputType != INPUTTYPE_UNSIGNED_INT_2_10_10_10) &&
       (local_1b0->inputType != INPUTTYPE_INT_2_10_10_10)) {
      std::ostream::operator<<(local_190,local_1b0->componentCount);
    }
    poVar4 = std::operator<<(local_190,"_");
    pcVar5 = "";
    if ((local_1b0->normalize & 1U) != 0) {
      pcVar5 = "normalized_";
    }
    poVar4 = std::operator<<(poVar4,pcVar5);
    gls::Array::outputTypeToString_abi_cxx11_
              (&local_220,(Array *)(ulong)local_1b0->outputType,type_00);
    poVar4 = std::operator<<(poVar4,(string *)&local_220);
    poVar4 = std::operator<<(poVar4,"_");
    gls::Array::usageTypeToString_abi_cxx11_(&local_240,(Array *)(ulong)local_1b0->usage,usage);
    poVar4 = std::operator<<(poVar4,(string *)&local_240);
    std::operator<<(poVar4,"_");
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
  }
  if (this->first != 0) {
    poVar4 = std::operator<<(local_190,"first");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->first);
    std::operator<<(poVar4,"_");
  }
  if (this->primitive == PRIMITIVE_POINTS) {
    std::operator<<(local_190,"points_");
  }
  else if (this->primitive == PRIMITIVE_TRIANGLES) {
    std::operator<<(local_190,"quads_");
  }
  std::ostream::operator<<(local_190,this->drawCount);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ndx);
  return __return_storage_ptr__;
}

Assistant:

std::string MultiVertexArrayTest::Spec::getName (void) const
{
	std::stringstream name;

	for (size_t ndx = 0; ndx < arrays.size(); ++ndx)
	{
		const ArraySpec& array = arrays[ndx];

		if (arrays.size() > 1)
			name << "array" << ndx << "_";

		name
			<< Array::storageToString(array.storage) << "_"
			<< array.offset << "_"
			<< array.stride << "_"
			<< Array::inputTypeToString((Array::InputType)array.inputType);
		if (array.inputType != Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 && array.inputType != Array::INPUTTYPE_INT_2_10_10_10)
			name << array.componentCount;
		name
			<< "_"
			<< (array.normalize ? "normalized_" : "")
			<< Array::outputTypeToString(array.outputType) << "_"
			<< Array::usageTypeToString(array.usage) << "_";
	}

	if (first)
		name << "first" << first << "_";

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			name << "quads_";
			break;
		case Array::PRIMITIVE_POINTS:
			name << "points_";
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	name << drawCount;

	return name.str();
}